

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O0

int32_t ucal_getTimeZoneDisplayName_63
                  (UCalendar *cal,UCalendarDisplayNameType type,char *locale,UChar *result,
                  int32_t resultLength,UErrorCode *status)

{
  undefined8 this;
  UBool UVar1;
  Char16Ptr local_420;
  Locale local_418;
  Locale local_338;
  Locale local_258;
  Locale local_178;
  undefined1 local_88 [8];
  UnicodeString id;
  TimeZone *tz;
  UErrorCode *status_local;
  int32_t resultLength_local;
  UChar *result_local;
  char *locale_local;
  UCalendarDisplayNameType type_local;
  UCalendar *cal_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    id.fUnion._48_8_ = icu_63::Calendar::getTimeZone((Calendar *)cal);
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_88);
    if ((result != (UChar *)0x0) || (resultLength != 0)) {
      icu_63::UnicodeString::setTo((UnicodeString *)local_88,result,0,resultLength);
    }
    this = id.fUnion._48_8_;
    switch(type) {
    case UCAL_STANDARD:
      icu_63::Locale::Locale(&local_178,locale,(char *)0x0,(char *)0x0,(char *)0x0);
      icu_63::TimeZone::getDisplayName
                ((TimeZone *)this,'\0',LONG,&local_178,(UnicodeString *)local_88);
      icu_63::Locale::~Locale(&local_178);
      break;
    case UCAL_SHORT_STANDARD:
      icu_63::Locale::Locale(&local_258,locale,(char *)0x0,(char *)0x0,(char *)0x0);
      icu_63::TimeZone::getDisplayName
                ((TimeZone *)this,'\0',SHORT,&local_258,(UnicodeString *)local_88);
      icu_63::Locale::~Locale(&local_258);
      break;
    case UCAL_DST:
      icu_63::Locale::Locale(&local_338,locale,(char *)0x0,(char *)0x0,(char *)0x0);
      icu_63::TimeZone::getDisplayName
                ((TimeZone *)this,'\x01',LONG,&local_338,(UnicodeString *)local_88);
      icu_63::Locale::~Locale(&local_338);
      break;
    case UCAL_SHORT_DST:
      icu_63::Locale::Locale(&local_418,locale,(char *)0x0,(char *)0x0,(char *)0x0);
      icu_63::TimeZone::getDisplayName
                ((TimeZone *)this,'\x01',SHORT,&local_418,(UnicodeString *)local_88);
      icu_63::Locale::~Locale(&local_418);
    }
    icu_63::Char16Ptr::Char16Ptr(&local_420,result);
    cal_local._4_4_ =
         icu_63::UnicodeString::extract((UnicodeString *)local_88,&local_420,resultLength,status);
    icu_63::Char16Ptr::~Char16Ptr(&local_420);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_88);
  }
  else {
    cal_local._4_4_ = -1;
  }
  return cal_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucal_getTimeZoneDisplayName(const     UCalendar*                 cal,
                    UCalendarDisplayNameType     type,
                    const char             *locale,
                    UChar*                  result,
                    int32_t                 resultLength,
                    UErrorCode*             status)
{

    if(U_FAILURE(*status)) return -1;

    const TimeZone& tz = ((Calendar*)cal)->getTimeZone();
    UnicodeString id;
    if(!(result==NULL && resultLength==0)) {
        // NULL destination for pure preflighting: empty dummy string
        // otherwise, alias the destination buffer
        id.setTo(result, 0, resultLength);
    }

    switch(type) {
  case UCAL_STANDARD:
      tz.getDisplayName(FALSE, TimeZone::LONG, Locale(locale), id);
      break;

  case UCAL_SHORT_STANDARD:
      tz.getDisplayName(FALSE, TimeZone::SHORT, Locale(locale), id);
      break;

  case UCAL_DST:
      tz.getDisplayName(TRUE, TimeZone::LONG, Locale(locale), id);
      break;

  case UCAL_SHORT_DST:
      tz.getDisplayName(TRUE, TimeZone::SHORT, Locale(locale), id);
      break;
    }

    return id.extract(result, resultLength, *status);
}